

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cpp
# Opt level: O0

int __thiscall model::load_model(model *this,string *file_path)

{
  pointer *__s;
  vector<float,_std::allocator<float>_> *this_00;
  char *__filename;
  FILE *__stream;
  undefined8 uVar1;
  unsigned_long uVar2;
  reference pvVar3;
  char buff2 [1000000];
  vector<float,_std::allocator<float>_> intercepts;
  undefined1 local_240 [8];
  vector<float,_std::allocator<float>_> params;
  char buff1 [512];
  FILE *fin;
  string *file_path_local;
  model *this_local;
  
  __filename = (char *)std::__cxx11::string::c_str();
  __stream = fopen(__filename,"r");
  if (__stream != (FILE *)0x0) {
    uVar1 = std::__cxx11::string::c_str();
    printf("Load model from %s\n",uVar1);
    __s = &params.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
           _M_end_of_storage;
    fgets((char *)__s,0x1ff,__stream);
    uVar2 = atol((char *)__s);
    this->num_features = uVar2;
    fgets((char *)__s,0x1ff,__stream);
    readFromSep<float>((vector<float,_std::allocator<float>_> *)local_240,(char *)__s,' ');
    pvVar3 = std::vector<float,_std::allocator<float>_>::operator[]
                       ((vector<float,_std::allocator<float>_> *)local_240,0);
    this->alpha = *pvVar3;
    pvVar3 = std::vector<float,_std::allocator<float>_>::operator[]
                       ((vector<float,_std::allocator<float>_> *)local_240,1);
    this->beta = *pvVar3;
    pvVar3 = std::vector<float,_std::allocator<float>_>::operator[]
                       ((vector<float,_std::allocator<float>_> *)local_240,2);
    this->lambda1 = *pvVar3;
    pvVar3 = std::vector<float,_std::allocator<float>_>::operator[]
                       ((vector<float,_std::allocator<float>_> *)local_240,3);
    this->lambda2 = *pvVar3;
    init_model(this);
    fgets((char *)&params.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage,0x1ff,__stream);
    readFromSep<float>((vector<float,_std::allocator<float>_> *)(buff2 + 0xf4238),
                       (char *)&params.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage,' ');
    this_00 = (vector<float,_std::allocator<float>_> *)(buff2 + 0xf4238);
    pvVar3 = std::vector<float,_std::allocator<float>_>::operator[](this_00,0);
    this->z_intercept = *pvVar3;
    pvVar3 = std::vector<float,_std::allocator<float>_>::operator[](this_00,1);
    this->n_intercept = *pvVar3;
    pvVar3 = std::vector<float,_std::allocator<float>_>::operator[](this_00,2);
    this->w_intercept = *pvVar3;
    fgets(&stack0xfffffffffff0bb58,999999,__stream);
    libsvm2sparse<float>
              ((vector<float,_std::allocator<float>_> *)&stack0xfffffffffff0bb40,
               &stack0xfffffffffff0bb58,this->num_features);
    std::vector<float,_std::allocator<float>_>::operator=
              (&this->z,(vector<float,_std::allocator<float>_> *)&stack0xfffffffffff0bb40);
    std::vector<float,_std::allocator<float>_>::~vector
              ((vector<float,_std::allocator<float>_> *)&stack0xfffffffffff0bb40);
    fgets(&stack0xfffffffffff0bb58,999999,__stream);
    libsvm2sparse<float>
              ((vector<float,_std::allocator<float>_> *)&stack0xfffffffffff0bb28,
               &stack0xfffffffffff0bb58,this->num_features);
    std::vector<float,_std::allocator<float>_>::operator=
              (&this->n,(vector<float,_std::allocator<float>_> *)&stack0xfffffffffff0bb28);
    std::vector<float,_std::allocator<float>_>::~vector
              ((vector<float,_std::allocator<float>_> *)&stack0xfffffffffff0bb28);
    fgets(&stack0xfffffffffff0bb58,999999,__stream);
    libsvm2sparse<float>
              ((vector<float,_std::allocator<float>_> *)&stack0xfffffffffff0bb10,
               &stack0xfffffffffff0bb58,this->num_features);
    std::vector<float,_std::allocator<float>_>::operator=
              (&this->w,(vector<float,_std::allocator<float>_> *)&stack0xfffffffffff0bb10);
    std::vector<float,_std::allocator<float>_>::~vector
              ((vector<float,_std::allocator<float>_> *)&stack0xfffffffffff0bb10);
    fclose(__stream);
    std::vector<float,_std::allocator<float>_>::~vector
              ((vector<float,_std::allocator<float>_> *)(buff2 + 0xf4238));
    std::vector<float,_std::allocator<float>_>::~vector
              ((vector<float,_std::allocator<float>_> *)local_240);
  }
  else {
    uVar1 = std::__cxx11::string::c_str();
    printf("Cannot open file %s to read!\n",uVar1);
  }
  this_local._4_4_ = (uint)(__stream == (FILE *)0x0);
  return this_local._4_4_;
}

Assistant:

int model::load_model(string & file_path) {
    FILE * fin = fopen(file_path.c_str(), "r");
    if (!fin) {
        printf("Cannot open file %s to read!\n", file_path.c_str());
        return 1;
    }
    printf("Load model from %s\n", file_path.c_str());

    char buff1[BUFF_SIZE_SHORT];

    //load num_features
    fgets(buff1, BUFF_SIZE_SHORT - 1, fin);
    num_features = (unsigned long)atol(buff1);

    //load alpha, beta, lambda1, lambda2
    fgets(buff1, BUFF_SIZE_SHORT - 1, fin);
    vector<float> params = readFromSep<float>(buff1, ' ');
    alpha = params[0], beta = params[1], lambda1 = params[2], lambda2 = params[3];

    init_model();

    //loda z_intercept, n_intercept, w_intercept
    fgets(buff1, BUFF_SIZE_SHORT - 1, fin);
    vector<float> intercepts = readFromSep<float>(buff1, ' ');
    z_intercept = intercepts[0], n_intercept = intercepts[1], w_intercept = intercepts[2];

    char buff2[BUFF_SIZE_LONG];

    //load z
    fgets(buff2, BUFF_SIZE_LONG - 1, fin);
    z = libsvm2sparse<float>(buff2, num_features);

    //load n
    fgets(buff2, BUFF_SIZE_LONG - 1, fin);
    n = libsvm2sparse<float>(buff2, num_features);

    //load w
    fgets(buff2, BUFF_SIZE_LONG - 1, fin);
    w = libsvm2sparse<float>(buff2, num_features);

    fclose(fin);
    return 0;
}